

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip.c
# Opt level: O1

int zip_entry_fwrite(zip_t *zip,char *filename)

{
  mz_uint32 *pmVar1;
  int iVar2;
  int iVar3;
  FILE *__stream;
  size_t bufsize;
  stat file_stat;
  mz_uint8 buf [65536];
  stat sStack_100b8;
  undefined1 auStack_10028 [65544];
  
  iVar3 = -1;
  if (zip != (zip_t *)0x0) {
    memset(auStack_10028,0,0x10000);
    memset(&sStack_100b8,0,0x90);
    iVar2 = stat(filename,&sStack_100b8);
    if (iVar2 == 0) {
      if (-1 < (char)sStack_100b8.st_mode) {
        pmVar1 = &(zip->entry).external_attr;
        *(byte *)pmVar1 = (byte)*pmVar1 | 1;
      }
      pmVar1 = &(zip->entry).external_attr;
      *pmVar1 = *pmVar1 | sStack_100b8.st_mode << 0x10;
      (zip->entry).m_time = sStack_100b8.st_mtim.tv_sec;
      __stream = fopen(filename,"rb");
      if (__stream != (FILE *)0x0) {
        do {
          bufsize = fread(auStack_10028,1,0x10000,__stream);
          if (bufsize == 0) {
            iVar3 = 0;
            goto LAB_003c3c28;
          }
          iVar3 = zip_entry_write(zip,auStack_10028,bufsize);
        } while (-1 < iVar3);
        iVar3 = -1;
LAB_003c3c28:
        fclose(__stream);
      }
    }
  }
  return iVar3;
}

Assistant:

int zip_entry_fwrite(struct zip_t *zip, const char *filename) {
  int status = 0;
  size_t n = 0;
  FILE *stream = NULL;
  mz_uint8 buf[MZ_ZIP_MAX_IO_BUF_SIZE];
  struct MZ_FILE_STAT_STRUCT file_stat;

  if (!zip) {
    // zip_t handler is not initialized
    return -1;
  }

  memset(buf, 0, MZ_ZIP_MAX_IO_BUF_SIZE);
  memset((void *)&file_stat, 0, sizeof(struct MZ_FILE_STAT_STRUCT));
  if (MZ_FILE_STAT(filename, &file_stat) != 0) {
    // problem getting information - check errno
    return -1;
  }

  if ((file_stat.st_mode & 0200) == 0) {
    // MS-DOS read-only attribute
    zip->entry.external_attr |= 0x01;
  }
  zip->entry.external_attr |= (mz_uint32)((file_stat.st_mode & 0xFFFF) << 16);
  zip->entry.m_time = file_stat.st_mtime;

#if defined(_MSC_VER)
  if (fopen_s(&stream, filename, "rb"))
#else
  if (!(stream = fopen(filename, "rb")))
#endif
  {
    // Cannot open filename
    return -1;
  }

  while ((n = fread(buf, sizeof(mz_uint8), MZ_ZIP_MAX_IO_BUF_SIZE, stream)) >
         0) {
    if (zip_entry_write(zip, buf, n) < 0) {
      status = -1;
      break;
    }
  }
  fclose(stream);

  return status;
}